

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamMemory.cpp
# Opt level: O3

size_t __thiscall Rml::StreamMemory::PushFront(StreamMemory *this,void *_buffer,size_t bytes)

{
  bool bVar1;
  size_t __n;
  
  __n = this->buffer_used;
  if (this->buffer_size < __n + bytes) {
    bVar1 = Reallocate(this,bytes + 0x100);
    if (!bVar1) {
      return 0;
    }
    __n = this->buffer_used;
  }
  memmove(this->buffer + bytes,this->buffer,__n);
  memcpy(this->buffer,_buffer,bytes);
  this->buffer_used = this->buffer_used + bytes;
  this->buffer_ptr = this->buffer_ptr + bytes;
  return bytes;
}

Assistant:

size_t StreamMemory::PushFront(const void* _buffer, size_t bytes)
{
	if (buffer_used + bytes > buffer_size)
		if (!Reallocate(bytes + BUFFER_INCREMENTS))
			return 0;

	memmove(&buffer[bytes], &buffer[0], buffer_used);
	memcpy(buffer, _buffer, bytes);
	buffer_used += bytes;
	buffer_ptr += bytes;
	return bytes;
}